

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_transport.c
# Opt level: O3

int tr_tcp_init(tr_tcp_config *config,tr_socket *socket)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 *puVar5;
  char *pcVar6;
  uint uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  socket->close_fp = tr_tcp_close;
  socket->free_fp = tr_tcp_free;
  socket->open_fp = tr_tcp_open;
  socket->recv_fp = tr_tcp_recv;
  socket->send_fp = tr_tcp_send;
  socket->ident_fp = tr_tcp_ident;
  puVar5 = (undefined4 *)lrtr_malloc(0x40);
  socket->socket = puVar5;
  *puVar5 = 0xffffffff;
  pcVar6 = lrtr_strdup(config->host);
  *(char **)(puVar5 + 2) = pcVar6;
  pcVar6 = lrtr_strdup(config->port);
  *(char **)(puVar5 + 4) = pcVar6;
  if (config->bindaddr == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = lrtr_strdup(config->bindaddr);
  }
  *(char **)(puVar5 + 6) = pcVar6;
  uVar7 = 0x1e;
  if (config->connect_timeout != 0) {
    uVar7 = config->connect_timeout;
  }
  puVar5[0xc] = uVar7;
  *(undefined8 *)(puVar5 + 0xe) = 0;
  uVar2 = *(undefined4 *)((long)&config->data + 4);
  uVar3 = *(undefined4 *)&config->new_socket;
  uVar4 = *(undefined4 *)((long)&config->new_socket + 4);
  puVar5[8] = *(undefined4 *)&config->data;
  puVar5[9] = uVar2;
  puVar5[10] = uVar3;
  puVar5[0xb] = uVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT int tr_tcp_init(const struct tr_tcp_config *config, struct tr_socket *socket)
{
	socket->close_fp = &tr_tcp_close;
	socket->free_fp = &tr_tcp_free;
	socket->open_fp = &tr_tcp_open;
	socket->recv_fp = &tr_tcp_recv;
	socket->send_fp = &tr_tcp_send;
	socket->ident_fp = &tr_tcp_ident;

	socket->socket = lrtr_malloc(sizeof(struct tr_tcp_socket));
	struct tr_tcp_socket *tcp_socket = socket->socket;

	tcp_socket->socket = -1;
	tcp_socket->config.host = lrtr_strdup(config->host);
	tcp_socket->config.port = lrtr_strdup(config->port);
	if (config->bindaddr)
		tcp_socket->config.bindaddr = lrtr_strdup(config->bindaddr);
	else
		tcp_socket->config.bindaddr = NULL;

	if (config->connect_timeout == 0)
		tcp_socket->config.connect_timeout = RTRLIB_TRANSPORT_CONNECT_TIMEOUT_DEFAULT;
	else
		tcp_socket->config.connect_timeout = config->connect_timeout;

	tcp_socket->ident = NULL;
	tcp_socket->config.data = config->data;
	tcp_socket->config.new_socket = config->new_socket;

	return TR_SUCCESS;
}